

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportTextTest.cpp
# Opt level: O2

void __thiscall GtestReportTextTest::GtestReportTextTest(GtestReportTextTest *this)

{
  _Head_base<0UL,_const_oout::Test_*,_false> _Var1;
  shared_ptr<oout::TestResult> local_1d0;
  unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  shared_ptr<oout::NamedResult> local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  shared_ptr<oout::SuccessResult> local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  shared_ptr<oout::SuccessResult> local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  shared_ptr<oout::SuccessResult> local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  shared_ptr<oout::SuccessResult> local_120;
  shared_ptr<oout::ContainTest> local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  shared_ptr<oout::FailureResult> local_f0;
  char local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  shared_ptr<oout::ContainTest> local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  shared_ptr<oout::SuccessResult> local_b0;
  char local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  shared_ptr<oout::ContainTest> local_90;
  shared_ptr<oout::FailureResult> local_80;
  char local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<oout::ContainTest> local_60;
  _Head_base<0UL,_const_oout::Test_*,_false> local_50;
  unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<oout::ContainTest> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__GtestReportTextTest_001ccca8;
  std::make_shared<oout::FailureResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_80);
  std::make_shared<oout::NamedResult,char_const(&)[9],std::shared_ptr<oout::TestResult>>
            ((char (*) [9])local_70,(shared_ptr<oout::TestResult> *)0x1a7bb4);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>(&local_198);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[22]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_60,(char (*) [22])&local_198);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_b0);
  std::make_shared<oout::NamedResult,char_const(&)[8],std::shared_ptr<oout::TestResult>>
            (&local_a0,(shared_ptr<oout::TestResult> *)0x1a7bca);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)(local_1a8 + 8));
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_90,(char (*) [21])(local_1a8 + 8));
  std::make_shared<oout::FailureResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_f0);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])local_e0,(shared_ptr<oout::TestResult> *)0x1a7bdf);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)local_1a8);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[23]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_d0,(char (*) [23])local_1a8);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_120);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)(local_1b8 + 8));
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_110,(char (*) [21])(local_1b8 + 8));
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_140);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)local_1b8);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[25]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_38,(char (*) [25])local_1b8);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_160);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_180);
  std::
  make_unique<oout::SuiteResult,std::shared_ptr<oout::TestResult>,std::shared_ptr<oout::TestResult>>
            (&local_1d0,(shared_ptr<oout::TestResult> *)&local_160);
  std::
  make_unique<oout::NamedResult,char_const(&)[6],std::unique_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>>>
            ((char (*) [6])
             &local_1d0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)0x1a7c30);
  std::
  make_unique<oout::GtestReportText,std::unique_ptr<oout::NamedResult,std::default_delete<oout::NamedResult>>>
            ((unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)&local_1c0);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[31]>
            (&local_48,(char (*) [31])&local_1c0);
  std::
  make_unique<oout::NamedTest,char_const(&)[20],std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>>
            ((char (*) [20])&local_50,(shared_ptr<oout::ContainTest> *)"GtestReportTextTest",
             &local_60,&local_90,&local_d0,&local_110,&local_38);
  _Var1._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Test *)0x0;
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr
            ((unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            (&local_1c0);
  std::unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_>::~unique_ptr
            ((unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)
             &local_1d0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_180.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_160.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_140.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_1b8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f0.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_1a8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

GtestReportTextTest::GtestReportTextTest()
: tests(
	make_unique<NamedTest>(
		"GtestReportTextTest",
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"run test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[ RUN      ] run test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"ok test",
					make_shared<TestResult>(make_shared<SuccessResult>())
				)
			),
			"[       OK ] ok test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"fail test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[  FAILED  ] fail test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] Running"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] 1 tests ran"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_unique<NamedResult>(
					"SUITE",
					make_unique<SuiteResult>(
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						),
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						)
					)
				)
			),
			"[----------] 2 test from SUITE"
		)
	)
)
{
}